

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_matrix2.c
# Opt level: O0

char * test_matrix2_equals(void)

{
  int iVar1;
  undefined1 local_50 [8];
  matrix2 identity;
  matrix2 m;
  
  matrix2_identity((matrix2 *)local_50);
  _matrix2_set_random((matrix2 *)((long)&identity.field_0 + 0x18));
  iVar1 = matrix2_equals((matrix2 *)local_50,(matrix2 *)local_50);
  if (iVar1 == 0) {
    m.field_0.m[3] = (double)anon_var_dwarf_3dc;
  }
  else {
    iVar1 = matrix2_equals((matrix2 *)local_50,(matrix2 *)((long)&identity.field_0 + 0x18));
    if (iVar1 == 0) {
      m.field_0.m[3] = 0.0;
    }
    else {
      m.field_0.m[3] = (double)anon_var_dwarf_3e6;
    }
  }
  return (char *)m.field_0.m[3];
}

Assistant:

static char *test_matrix2_equals(void)
{
	struct matrix2 m, identity;

	matrix2_identity(&identity);
	_matrix2_set_random(&m);

	/* equal */
	test_assert(matrix2_equals(&identity, &identity));

	/* not-equal */
	test_assert(matrix2_equals(&identity, &m) == 0);

	return NULL;
}